

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

size_t __thiscall Memory::HeapInfo::GetUsedBytes(HeapInfo *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  
  if ((Js::Configuration::Global[0x2c156] == '\x01') &&
     ((this->recyclerPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.usedBytes !=
      0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x87c,"(recyclerPageAllocator.usedBytes == 0)",
                       "recyclerPageAllocator.usedBytes == 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return (this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator
         .usedBytes +
         (this->recyclerPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.usedBytes
         + (this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator.
           super_PageAllocator.usedBytes +
         (this->recyclerLeafPageAllocator->super_PageAllocator).usedBytes;
}

Assistant:

size_t
HeapInfo::GetUsedBytes()
{
#if GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        Assert(recyclerPageAllocator.usedBytes == 0);
    }
#endif

    size_t usedBytes = 0;
    ForEachPageAllocator([&](IdleDecommitPageAllocator * pageAlloc)
    {
        usedBytes += pageAlloc->usedBytes;
    });
    return usedBytes;
}